

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextBlockData>::maximum(QFragmentMapData<QTextBlockData> *this,uint n)

{
  uint uVar1;
  
  do {
    uVar1 = n;
    if (uVar1 == 0) {
      return 0;
    }
    n = *(uint *)((long)(this->field_0).head + (ulong)uVar1 * 0x48 + 8);
  } while (n != 0);
  return uVar1;
}

Assistant:

uint maximum(uint n) const {
        while (n && fragment(n)->right)
            n = fragment(n)->right;
        return n;
    }